

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O1

int identify_regions(FIRSTPASS_STATS *stats_start,int total_frames,int offset,REGIONS *regions,
                    int *total_regions)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  bool bVar4;
  int iVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int *num_regions_00;
  int iVar8;
  REGIONS *regions_00;
  double *pdVar9;
  double *pdVar10;
  ulong uVar11;
  uint uVar12;
  REGION_TYPES *pRVar13;
  uint uVar14;
  long lVar15;
  int64_t *piVar16;
  undefined4 in_register_00000034;
  ulong uVar17;
  int iVar18;
  REGION_TYPES RVar19;
  REGIONS *pRVar20;
  uint uVar21;
  int iVar22;
  ulong uVar23;
  int64_t *piVar24;
  long lVar25;
  long lVar26;
  uint uVar27;
  int iVar28;
  long lVar29;
  uint uVar30;
  uint uVar31;
  REGIONS *regions_01;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  double total_wt;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  double dVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  int num_regions;
  uint local_f0;
  uint local_ec;
  int local_e8;
  uint local_e4;
  double *local_e0;
  REGIONS *local_d8;
  int local_cc;
  double local_c8;
  ulong local_c0;
  int64_t *local_b8;
  double *local_b0;
  REGIONS *local_a8;
  double *local_a0;
  double *local_98;
  undefined8 local_90;
  int local_84;
  double *local_80;
  double *local_78;
  long local_70;
  int64_t *local_68;
  REGION_TYPES *local_60;
  int *local_58;
  double local_50;
  REGION_TYPES *local_48;
  double *local_40;
  double *local_38;
  
  local_90 = CONCAT44(in_register_00000034,total_frames);
  iVar8 = 0;
  if (1 < total_frames) {
    uVar17 = (ulong)(uint)total_frames;
    local_a8 = regions;
    local_84 = offset;
    local_58 = total_regions;
    regions_00 = (REGIONS *)aom_malloc(uVar17 * 0x38);
    pdVar9 = (double *)aom_calloc(uVar17,8);
    pdVar10 = (double *)aom_calloc(uVar17,8);
    local_b0 = (double *)aom_calloc(uVar17,8);
    auVar36._0_4_ = -(uint)((int)regions_00 == 0 && (int)((ulong)regions_00 >> 0x20) == 0);
    auVar36._4_4_ = -(uint)((int)pdVar9 == 0 && (int)((ulong)pdVar9 >> 0x20) == 0);
    auVar36._8_4_ = -(uint)((int)pdVar10 == 0 && (int)((ulong)pdVar10 >> 0x20) == 0);
    auVar36._12_4_ = -(uint)((int)local_b0 == 0 && (int)((ulong)local_b0 >> 0x20) == 0);
    iVar8 = movmskps((int)local_b0,auVar36);
    if (iVar8 == 0) {
      pRVar20 = regions_00;
      local_e0 = pdVar9;
      memset(regions_00,0,uVar17 * 0x38);
      local_e4 = (int)local_90 - 1;
      piVar16 = &stats_start[-1].is_flash;
      local_70 = (long)(int)local_e4;
      local_a0 = &stats_start[-1].intra_error;
      local_60 = &regions_00[-1].type;
      local_38 = &regions_00[-1].avg_cor_coeff;
      local_80 = &stats_start->coded_error;
      local_78 = &stats_start->intra_error;
      local_40 = &stats_start[1].intra_error;
      local_68 = &stats_start->is_flash;
      local_48 = &regions_00->type;
      uVar31 = 0;
      local_c0 = 0;
      local_b8 = piVar16;
      local_98 = pdVar10;
      do {
        if ((int)uVar31 < (int)local_90 && local_e4 != uVar31) {
          uVar11 = (ulong)(int)uVar31;
          uVar12 = uVar31 - 3;
          uVar17 = uVar11;
          uVar14 = uVar31;
          local_d8 = pRVar20;
          do {
            uVar14 = uVar14 + 1;
            uVar23 = (long)(int)uVar12;
            if ((long)(int)uVar12 < (long)uVar11) {
              uVar23 = uVar11;
            }
            uVar30 = uVar12;
            if ((int)uVar12 < (int)uVar31) {
              uVar30 = uVar31;
            }
            if ((stats_start[uVar17].is_flash == 0) &&
               (((long)uVar17 < 1 || (piVar16[uVar17 * 0x1d] == 0)))) {
              dVar42 = stats_start[uVar17].intra_error;
              if (dVar42 <= 0.01) {
                dVar42 = 0.01;
              }
              dVar46 = 0.0;
              dVar37 = 0.0;
              auVar39 = ZEXT816(0);
              dVar44 = 0.0;
              if ((long)uVar11 < (long)uVar17) {
                piVar24 = piVar16 + uVar23 * 0x1d;
                lVar29 = (long)(int)uVar30;
                do {
                  if ((piVar24[0x1d] == 0) && ((lVar29 < 1 || (*piVar24 == 0)))) {
                    dVar44 = (double)piVar24[7];
                    dVar45 = (double)piVar24[9];
                    if (dVar44 <= 0.01) {
                      dVar44 = 0.01;
                    }
                    dVar47 = dVar45 / dVar44;
                    if (dVar45 / dVar44 <= auVar39._0_8_) {
                      dVar47 = auVar39._0_8_;
                    }
                    if (dVar45 <= dVar37) {
                      dVar45 = dVar37;
                    }
                    auVar39._8_8_ = 0;
                    auVar39._0_8_ = dVar47;
                    dVar37 = dVar45;
                  }
                  dVar44 = auVar39._0_8_;
                  lVar29 = lVar29 + 1;
                  piVar24 = piVar24 + 0x1d;
                } while (lVar29 < (long)uVar17);
              }
              dVar45 = 0.0;
              if ((long)uVar17 < local_70) {
                lVar29 = (long)(int)uVar14 + -1;
                pdVar9 = local_80 + (long)(int)uVar14 * 0x1d;
                uVar30 = (int)uVar17 + 3;
                if ((int)local_e4 <= (int)uVar30) {
                  uVar30 = local_e4;
                }
                auVar40 = ZEXT816(0);
                do {
                  if (((long)uVar17 < 1) || (local_b8[uVar17 * 0x1d] == 0)) {
                    dVar46 = pdVar9[-2];
                    dVar47 = *pdVar9;
                    if (dVar46 <= 0.01) {
                      dVar46 = 0.01;
                    }
                    dVar43 = dVar47 / dVar46;
                    if (dVar47 / dVar46 <= dVar45) {
                      dVar43 = dVar45;
                    }
                    dVar45 = dVar43;
                    if (dVar47 <= auVar40._0_8_) {
                      dVar47 = auVar40._0_8_;
                    }
                    auVar40._8_8_ = 0;
                    auVar40._0_8_ = dVar47;
                  }
                  dVar46 = auVar40._0_8_;
                  lVar29 = lVar29 + 1;
                  pdVar9 = pdVar9 + 0x1d;
                  piVar16 = local_b8;
                } while (lVar29 < (int)uVar30);
              }
              dVar47 = stats_start[uVar17].coded_error;
              if ((0.001 <= dVar44) || (0.001 <= dVar45)) {
                dVar43 = stats_start[uVar17].sr_coded_error;
                if (((long)uVar17 < local_70) && (dVar43 <= stats_start[uVar17 + 1].sr_coded_error))
                {
                  dVar43 = stats_start[uVar17 + 1].sr_coded_error;
                }
                dVar48 = dVar47;
                if (dVar47 <= 0.01) {
                  dVar48 = 0.01;
                }
                iVar8 = 4;
                if (dVar43 / dVar48 <= 1.2) {
                  if (dVar44 <= dVar45) {
                    dVar44 = dVar45;
                  }
                  if (dVar47 / dVar42 < dVar44 + dVar44) {
                    if (dVar37 <= dVar46) {
                      dVar37 = dVar46;
                    }
                    if (dVar47 < dVar37 + dVar37) goto LAB_00203f2a;
                  }
                  iVar8 = 0;
                  bVar32 = true;
                }
                else {
LAB_00203f2a:
                  bVar32 = false;
                }
                if (bVar32) goto LAB_00203f55;
              }
              else {
                iVar8 = 4;
                if (0.02 <= dVar47 / dVar42) {
LAB_00203f55:
                  iVar8 = 1;
                  local_d8 = (REGIONS *)(uVar17 & 0xffffffff);
                }
              }
              if (iVar8 != 4) goto LAB_00203f93;
            }
            uVar17 = uVar17 + 1;
            uVar12 = uVar12 + 1;
          } while ((int)uVar17 != (int)local_90);
          local_d8 = (REGIONS *)0xffffffff;
        }
        else {
          local_d8 = (REGIONS *)0xffffffff;
        }
LAB_00203f93:
        uVar12 = (int)local_d8 - 1;
        if ((int)local_d8 < 0) {
          uVar12 = local_e4;
        }
        if ((int)uVar31 <= (int)uVar12) {
          lVar29 = (long)(int)uVar31;
          uVar14 = uVar31 - 3;
          uVar30 = uVar14;
          do {
            dVar42 = 0.0;
            lVar25 = 0;
            uVar21 = uVar30;
            do {
              uVar27 = uVar31;
              if ((int)uVar31 < (int)uVar21) {
                uVar27 = uVar21;
              }
              if ((int)uVar12 <= (int)uVar27) {
                uVar27 = uVar12;
              }
              if (stats_start[(int)uVar27].is_flash == 0) {
                dVar37 = *(double *)((long)&smooth_filter_stats_smooth_filt + lVar25);
                local_e0[lVar29] = stats_start[(int)uVar27].intra_error * dVar37 + local_e0[lVar29];
                dVar42 = dVar42 + dVar37;
              }
              lVar25 = lVar25 + 8;
              uVar21 = uVar21 + 1;
            } while (lVar25 != 0x38);
            if (dVar42 <= 0.01) {
              dVar42 = stats_start[lVar29].intra_error;
            }
            else {
              dVar42 = local_e0[lVar29] / dVar42;
            }
            local_e0[lVar29] = dVar42;
            lVar29 = lVar29 + 1;
            uVar30 = uVar30 + 1;
          } while (uVar12 + 1 != (int)lVar29);
          if ((int)uVar31 <= (int)uVar12) {
            lVar29 = (long)(int)uVar31;
            do {
              dVar42 = 0.0;
              lVar25 = 0;
              uVar30 = uVar14;
              do {
                uVar21 = uVar31;
                if ((int)uVar31 < (int)uVar30) {
                  uVar21 = uVar30;
                }
                uVar17 = (ulong)uVar21;
                if ((int)uVar12 <= (int)uVar21) {
                  uVar17 = (ulong)uVar12;
                }
                iVar8 = (int)uVar17;
                if ((stats_start[iVar8].is_flash == 0) &&
                   ((iVar8 < 1 || (piVar16[uVar17 * 0x1d] == 0)))) {
                  dVar37 = *(double *)((long)&smooth_filter_stats_smooth_filt + lVar25);
                  pdVar10[lVar29] = stats_start[iVar8].coded_error * dVar37 + pdVar10[lVar29];
                  dVar42 = dVar42 + dVar37;
                }
                lVar25 = lVar25 + 8;
                uVar30 = uVar30 + 1;
              } while (lVar25 != 0x38);
              if (dVar42 <= 0.01) {
                dVar42 = stats_start[lVar29].coded_error;
              }
              else {
                dVar42 = pdVar10[lVar29] / dVar42;
              }
              pdVar10[lVar29] = dVar42;
              lVar29 = lVar29 + 1;
              uVar14 = uVar14 + 1;
            } while (uVar12 + 1 != (int)lVar29);
          }
        }
        if (uVar31 == uVar12) {
          local_b0[uVar31] = 0.0;
LAB_0020417e:
          iVar8 = 0;
          regions_00->start = uVar31;
          if ((int)uVar31 <= (int)uVar12) {
            lVar29 = (long)(int)uVar31;
            iVar8 = 0;
            do {
              iVar22 = -3;
              iVar18 = 0;
              auVar38._8_8_ = 0x3f50624dd2f1a9fc;
              auVar38._0_8_ = 0x3f50624dd2f1a9fc;
              auVar35._8_8_ = 0x3f50624dd2f1a9fc;
              auVar35._0_8_ = 0x3f50624dd2f1a9fc;
              do {
                iVar5 = (int)lVar29;
                uVar14 = iVar5 + iVar22;
                if (iVar5 + iVar22 <= (int)uVar31) {
                  uVar14 = uVar31;
                }
                uVar17 = (ulong)uVar14;
                if ((int)uVar12 <= (int)uVar14) {
                  uVar17 = (ulong)uVar12;
                }
                iVar28 = (int)uVar17;
                if ((stats_start[iVar28].is_flash == 0) &&
                   ((iVar28 < 1 || (piVar16[uVar17 * 0x1d] == 0)))) {
                  dVar44 = auVar35._0_8_;
                  dVar42 = stats_start[iVar28].intra_error;
                  dVar37 = stats_start[iVar28].coded_error;
                  dVar46 = auVar38._0_8_;
                  iVar18 = iVar18 + 1;
                  auVar38._8_8_ = auVar38._8_8_ + dVar37;
                  auVar38._0_8_ = dVar37 * dVar37 + dVar46;
                  auVar35._8_8_ = auVar35._8_8_ + dVar42;
                  auVar35._0_8_ = dVar42 * dVar42 + dVar44;
                }
                iVar22 = iVar22 + 1;
              } while (iVar22 != 4);
              if (iVar18 < 1) {
                RVar19 = HIGH_VAR_REGION;
              }
              else {
                auVar41._0_8_ = (double)iVar18;
                auVar41._8_8_ = auVar41._0_8_;
                auVar36 = divpd(auVar35,auVar41);
                auVar39 = divpd(auVar38,auVar41);
                dVar42 = auVar36._8_8_;
                dVar37 = auVar39._8_8_;
                if ((1.04 <= auVar39._0_8_ / (dVar37 * dVar37)) ||
                   (bVar32 = true, 0.05 <= ABS(local_b0[lVar29]) / dVar37)) {
                  bVar32 = dVar37 / dVar42 < 0.05;
                }
                RVar19 = (byte)(dVar42 * 0.5 <= dVar37 | ~bVar32 |
                               1.03 <= auVar36._0_8_ / (dVar42 * dVar42)) & HIGH_VAR_REGION;
              }
              pRVar13 = &regions_00[iVar8].type;
              if (regions_00[iVar8].start == iVar5) {
LAB_00204314:
                *pRVar13 = RVar19;
              }
              else if (RVar19 != *pRVar13) {
                regions_00[iVar8].last = iVar5 + -1;
                iVar8 = iVar8 + 1;
                regions_00[iVar8].start = iVar5;
                pRVar13 = &regions_00[iVar8].type;
                goto LAB_00204314;
              }
              lVar29 = lVar29 + 1;
            } while (uVar12 + 1 != (int)lVar29);
          }
        }
        else {
          if ((int)uVar31 <= (int)uVar12) {
            pdVar9 = local_b0 + (int)uVar31;
            uVar14 = uVar31 - 1;
            do {
              uVar30 = uVar31;
              if ((int)uVar31 < (int)uVar14) {
                uVar30 = uVar14;
              }
              uVar21 = uVar14 + 2;
              if ((int)uVar12 <= (int)(uVar14 + 2)) {
                uVar21 = uVar12;
              }
              *pdVar9 = (pdVar10[(int)uVar21] - pdVar10[(int)uVar30]) /
                        (double)(int)(uVar21 - uVar30);
              pdVar9 = pdVar9 + 1;
              uVar14 = uVar14 + 1;
            } while (uVar12 != uVar14);
            goto LAB_0020417e;
          }
          regions_00->start = uVar31;
          iVar8 = 0;
        }
        regions_00[iVar8].last = uVar12;
        local_ec = iVar8 + 1;
        lVar29 = 0;
        remove_short_regions(regions_00,(int *)&local_ec,STABLE_REGION,3);
        remove_short_regions(regions_00,(int *)&local_ec,HIGH_VAR_REGION,3);
        uVar31 = local_ec;
        lVar25 = (long)(int)local_ec;
        if (0 < lVar25) {
          uVar12 = 0;
          do {
            analyze_region(stats_start,uVar12,regions_00);
            uVar12 = uVar12 + 1;
          } while (uVar31 != uVar12);
          if ((int)uVar31 < 1) {
            lVar29 = 0;
          }
          else {
            lVar29 = 0;
            do {
              if (regions_00[lVar29].type != STABLE_REGION) {
                if (lVar29 != 0) {
                  iVar8 = regions_00[lVar29 + -1].last;
                  lVar15 = (long)iVar8;
                  iVar18 = regions_00[lVar29 + -1].start;
                  iVar22 = iVar18 + 1;
                  if (iVar18 + 1 < iVar8 + -6) {
                    iVar22 = iVar8 + -6;
                  }
                  if (iVar18 < iVar8) {
                    lVar26 = (long)iVar18 + 1;
                    if ((long)iVar18 + 1 < lVar15 + -6) {
                      lVar26 = lVar15 + -6;
                    }
                    iVar18 = (iVar8 + 1) - iVar22;
                    pdVar10 = local_78 + lVar26 * 0x1d;
                    dVar42 = 0.0;
                    do {
                      dVar42 = dVar42 + *pdVar10;
                      pdVar10 = pdVar10 + 0x1d;
                      iVar18 = iVar18 + -1;
                    } while (iVar18 != 0);
                    iVar22 = (iVar8 + 1) - iVar22;
                  }
                  else {
                    dVar42 = 0.0;
                    iVar22 = 0;
                  }
                  if (iVar22 != 0) {
                    dVar42 = dVar42 / (double)iVar22;
                    if (dVar42 <= 0.001) {
                      dVar42 = 0.001;
                    }
                    if (iVar8 < regions_00[lVar29].last) {
                      iVar8 = iVar8 + 2;
                      pdVar10 = local_40 + lVar15 * 0x1d;
                      iVar18 = 0;
                      do {
                        if ((0.1 <= ABS(*pdVar10 - dVar42) / dVar42) ||
                           (iVar18 = iVar18 - (uint)(pdVar10[0x18] <= 0.995 ||
                                                    0.1 <= pdVar10[2] / dVar42), iVar18 < 0)) break;
                        lVar15 = lVar15 + 1;
                        (regions_00 + lVar29)[-1].last = iVar8 + -1;
                        regions_00[lVar29].start = iVar8;
                        iVar8 = iVar8 + 1;
                        pdVar10 = pdVar10 + 0x1d;
                      } while (lVar15 < regions_00[lVar29].last);
                    }
                  }
                }
                if (lVar29 < lVar25 + -1) {
                  iVar8 = regions_00[lVar29 + 1].start;
                  lVar15 = (long)iVar8;
                  iVar18 = regions_00[lVar29 + 1].last + -1;
                  if (iVar8 + 6 < regions_00[lVar29 + 1].last) {
                    iVar18 = iVar8 + 6;
                  }
                  if (iVar18 < iVar8) {
                    iVar18 = 0;
                    dVar42 = 0.0;
                  }
                  else {
                    iVar22 = (iVar18 + 1) - iVar8;
                    pdVar10 = local_78 + lVar15 * 0x1d;
                    dVar42 = 0.0;
                    do {
                      dVar42 = dVar42 + *pdVar10;
                      pdVar10 = pdVar10 + 0x1d;
                      iVar22 = iVar22 + -1;
                    } while (iVar22 != 0);
                    iVar18 = (iVar18 + 1) - iVar8;
                  }
                  if (iVar18 != 0) {
                    pRVar20 = regions_00 + lVar29;
                    dVar42 = dVar42 / (double)iVar18;
                    if (dVar42 <= 0.001) {
                      dVar42 = 0.001;
                    }
                    if (pRVar20->start < iVar8) {
                      iVar8 = iVar8 + -2;
                      pdVar10 = local_80 + lVar15 * 0x1d;
                      iVar18 = 1;
                      do {
                        if ((0.1 <= ABS(pdVar10[-0x1f] - dVar42) / dVar42) ||
                           (iVar18 = iVar18 - (uint)(pdVar10[-7] <= 0.995 ||
                                                    0.1 <= *pdVar10 / dVar42), iVar18 < 0)) break;
                        lVar15 = lVar15 + -1;
                        pRVar20[1].start = iVar8 + 1;
                        regions_00[lVar29].last = iVar8;
                        iVar8 = iVar8 + -1;
                        pdVar10 = pdVar10 + -0x1d;
                      } while (pRVar20->start < lVar15);
                    }
                  }
                }
              }
              lVar29 = lVar29 + 1;
            } while (lVar29 != lVar25);
          }
        }
        local_f0 = (uint)lVar29;
        cleanup_regions(regions_00,(int *)&local_ec);
        remove_short_regions(regions_00,(int *)&local_ec,HIGH_VAR_REGION,3);
        uVar31 = local_ec;
        if (0 < (int)local_ec) {
          uVar12 = 0;
          do {
            analyze_region(stats_start,uVar12,regions_00);
            uVar12 = uVar12 + 1;
          } while (uVar31 != uVar12);
        }
        local_f0 = 0;
        do {
          if ((int)uVar31 < 2) break;
          pRVar20 = regions_00 + (int)local_f0;
          if (regions_00[(int)local_f0].type == HIGH_VAR_REGION) {
            if ((0 < (int)local_f0) && (pRVar20->last - pRVar20->start < 0xd)) {
              if ((((pRVar20->avg_coded_err < regions_00[(ulong)local_f0 - 1].avg_coded_err * 0.99)
                   || (regions_00[(ulong)local_f0 - 1].avg_cor_coeff * 1.001 <
                       pRVar20->avg_cor_coeff)) && ((int)local_f0 < (int)(uVar31 - 1))) &&
                 ((pRVar20->avg_coded_err < pRVar20[1].avg_coded_err * 0.99 ||
                  (pRVar20[1].avg_cor_coeff * 1.001 < pRVar20->avg_cor_coeff)))) goto LAB_0020476a;
            }
LAB_00204794:
            local_f0 = local_f0 + 1;
          }
          else {
            if ((regions_00[(int)local_f0].type != STABLE_REGION) ||
               (((int)local_f0 < 1 || (0xc < pRVar20->last - pRVar20->start)))) goto LAB_00204794;
            if (((pRVar20->avg_coded_err <= regions_00[(ulong)local_f0 - 1].avg_coded_err * 1.01) &&
                (dVar42 = regions_00[(ulong)local_f0 - 1].avg_cor_coeff * 0.999,
                dVar42 < pRVar20->avg_cor_coeff || dVar42 == pRVar20->avg_cor_coeff)) ||
               (((int)(uVar31 - 1) <= (int)local_f0 ||
                ((pRVar20->avg_coded_err <= pRVar20[1].avg_coded_err * 1.01 &&
                 (dVar42 = pRVar20[1].avg_cor_coeff * 0.999,
                 dVar42 < pRVar20->avg_cor_coeff || dVar42 == pRVar20->avg_cor_coeff))))))
            goto LAB_00204794;
LAB_0020476a:
            remove_region(2,regions_00,(int *)&local_ec,(int *)&local_f0);
            analyze_region(stats_start,local_f0 - 1,regions_00);
          }
          uVar31 = local_ec;
        } while ((int)local_f0 < (int)local_ec);
        remove_short_regions(regions_00,(int *)&local_ec,STABLE_REGION,7);
        remove_short_regions(regions_00,(int *)&local_ec,HIGH_VAR_REGION,3);
        uVar31 = local_ec;
        if ((int)local_ec < 1) {
LAB_002049e8:
          local_f0 = 0;
          bVar32 = true;
        }
        else {
          uVar12 = 0;
          do {
            analyze_region(stats_start,uVar12,regions_00);
            uVar12 = uVar12 + 1;
          } while (uVar31 != uVar12);
          local_f0 = 0;
          if ((int)uVar31 < 1) goto LAB_002049e8;
          iVar8 = 0;
          do {
            local_c8 = (double)CONCAT44(local_c8._4_4_,iVar8);
            while (regions_00[(int)local_f0].type != STABLE_REGION) {
              iVar8 = regions_00[(int)local_f0].start;
              lVar29 = (long)(int)local_f0;
              iVar18 = regions_00[lVar29].last;
              if (iVar18 < iVar8) {
                bVar32 = true;
                iVar8 = 0;
              }
              else {
                piVar16 = local_68 + (long)iVar8 * 0x1d;
                iVar22 = 0;
                uVar11 = 0;
                uVar17 = (long)iVar8;
                do {
                  iVar8 = (int)uVar17;
                  if (((((int)lVar29 != 0) || (iVar8 != regions_00[lVar29].start)) &&
                      (*piVar16 == 0)) && (((long)uVar17 < 1 || (piVar16[-0x1d] == 0)))) {
                    dVar42 = (double)piVar16[-0x16];
                    dVar37 = dVar42 - (double)piVar16[-0x33];
                    if (dVar42 <= 0.01) {
                      dVar42 = 0.01;
                    }
                    iVar18 = ((0.0 < dVar37) - 1) + (uint)(0.0 < dVar37);
                    if (ABS(dVar37) / dVar42 <= 0.05) {
                      iVar18 = 0;
                    }
                    if (iVar22 != iVar18) {
                      if (iVar22 != 0) {
                        insert_region((int)uVar11,iVar8 + -1,BLENDING_REGION,regions_00,
                                      (int *)&local_ec,(int *)&local_f0);
                      }
                      iVar22 = iVar18;
                      if ((local_f0 == 0) && (iVar8 == regions_00->start + 1)) {
                        uVar11 = (ulong)(iVar8 - 1);
                      }
                      else {
                        uVar11 = uVar17 & 0xffffffff;
                      }
                    }
                  }
                  iVar8 = (int)uVar11;
                  lVar29 = (long)(int)local_f0;
                  iVar18 = regions_00[lVar29].last;
                  piVar16 = piVar16 + 0x1d;
                  bVar32 = (long)uVar17 < (long)iVar18;
                  uVar17 = uVar17 + 1;
                } while (bVar32);
                bVar32 = iVar22 == 0;
              }
              if (!bVar32) {
                insert_region(iVar8,iVar18,BLENDING_REGION,regions_00,(int *)&local_ec,
                              (int *)&local_f0);
              }
              local_f0 = local_f0 + 1;
              if ((int)local_ec <= (int)local_f0) {
                bVar32 = local_c8._0_4_ == 0;
                uVar31 = local_ec;
                goto LAB_002049eb;
              }
            }
            local_f0 = local_f0 + 1;
            iVar8 = local_c8._0_4_ + 1;
            bVar32 = false;
            uVar31 = local_ec;
          } while ((int)local_f0 < (int)local_ec);
        }
LAB_002049eb:
        if (0 < (int)uVar31) {
          uVar12 = 0;
          do {
            analyze_region(stats_start,uVar12,regions_00);
            uVar12 = uVar12 + 1;
          } while (uVar31 != uVar12);
        }
        uVar31 = local_ec;
        uVar17 = (ulong)(int)local_ec;
        if (0 < (long)uVar17) {
          uVar11 = 0;
          pRVar13 = local_48;
          do {
            if ((*pRVar13 == BLENDING_REGION) &&
               ((pRVar13[-0xb] == ((REGIONS *)(pRVar13 + -0xc))->start ||
                (*(double *)(pRVar13 + -8) <= 0.6 && *(double *)(pRVar13 + -8) != 0.6 || bVar32))))
            {
              *pRVar13 = HIGH_VAR_REGION;
            }
            uVar11 = uVar11 + 1;
            pRVar13 = pRVar13 + 0xe;
          } while (uVar17 != uVar11);
          local_f0 = (uint)uVar11;
          if (0 < (int)local_ec) {
            uVar12 = 0;
            do {
              analyze_region(stats_start,uVar12,regions_00);
              uVar12 = uVar12 + 1;
            } while (uVar31 != uVar12);
          }
        }
        local_f0 = 1;
        piVar16 = local_b8;
        if (1 < (int)uVar31) {
          do {
            if (((((int)local_f0 < (int)uVar17 + -1) &&
                 (regions_00[(int)local_f0].type == HIGH_VAR_REGION)) &&
                (pRVar20 = regions_00 + (int)local_f0, pRVar20[-1].type == BLENDING_REGION)) &&
               ((pRVar20[1].type == BLENDING_REGION && (pRVar20->last - pRVar20->start < 3)))) {
              if ((local_a0[(long)pRVar20[-1].last * 0x1d] <=
                   stats_start[pRVar20[-1].last].intra_error &&
                   stats_start[pRVar20[-1].last].intra_error !=
                   local_a0[(long)pRVar20[-1].last * 0x1d]) ||
                 (stats_start[pRVar20[1].last].intra_error < local_a0[(long)pRVar20[1].last * 0x1d]
                  || stats_start[pRVar20[1].last].intra_error ==
                     local_a0[(long)pRVar20[1].last * 0x1d])) {
LAB_00204b8e:
                iVar8 = 0;
              }
              else {
                dVar37 = pRVar20->avg_sr_fr_ratio;
                dVar42 = pRVar20[-1].avg_sr_fr_ratio;
                if (pRVar20[1].avg_sr_fr_ratio <= pRVar20[-1].avg_sr_fr_ratio) {
                  dVar42 = pRVar20[1].avg_sr_fr_ratio;
                }
                dVar42 = dVar42 * 0.95;
                iVar8 = 0;
                if (dVar42 < dVar37) {
                  pRVar20->type = BLENDING_REGION;
                  local_c8 = dVar42;
                  local_50 = dVar37;
                  remove_region(2,regions_00,(int *)&local_ec,(int *)&local_f0);
                  analyze_region(stats_start,local_f0 - 1,regions_00);
                  iVar8 = 10;
                  dVar42 = local_c8;
                  dVar37 = local_50;
                }
                if (dVar37 <= dVar42) goto LAB_00204b8e;
              }
              if (iVar8 == 0) goto LAB_00204b98;
            }
            else {
LAB_00204b98:
              lVar29 = (long)(int)local_f0;
              if ((regions_00[lVar29 + -1].type == BLENDING_REGION) &&
                 (regions_00[lVar29].type == BLENDING_REGION)) {
                iVar8 = regions_00[lVar29].last;
                if (iVar8 - regions_00[lVar29 + -1].start < 3) {
                  regions_00[lVar29 + -1].type = HIGH_VAR_REGION;
                  local_f0 = local_f0 + 1;
                  goto LAB_00204cfc;
                }
                iVar18 = regions_00[lVar29 + -1].last;
                if ((stats_start[iVar18].intra_error < stats_start[(long)iVar18 + -1].intra_error ||
                     stats_start[iVar18].intra_error == stats_start[(long)iVar18 + -1].intra_error)
                   && (local_a0[(long)iVar8 * 0x1d] <= stats_start[iVar8].intra_error &&
                       stats_start[iVar8].intra_error != local_a0[(long)iVar8 * 0x1d])) {
                  iVar8 = iVar18 - regions_00[lVar29 + -1].start;
                  if (iVar8 < 2) {
                    dVar42 = stats_start[iVar18].coded_error;
                    if (stats_start[iVar18].coded_error <=
                        stats_start[(long)iVar18 + -1].coded_error) {
                      dVar42 = stats_start[(long)iVar18 + -1].coded_error;
                    }
                    if (dVar42 <= 0.001) {
                      dVar42 = 0.001;
                    }
                    dVar42 = stats_start[iVar18].sr_coded_error / dVar42;
                    dVar37 = regions_00[lVar29].avg_sr_fr_ratio;
                  }
                  else {
                    dVar42 = stats_start[iVar18].coded_error;
                    if (stats_start[iVar18].coded_error <=
                        stats_start[(long)iVar18 + -1].coded_error) {
                      dVar42 = stats_start[(long)iVar18 + -1].coded_error;
                    }
                    if (dVar42 <= 0.001) {
                      dVar42 = 0.001;
                    }
                    dVar42 = stats_start[iVar18].sr_coded_error / dVar42;
                    dVar37 = ((double)(iVar8 + 1) * regions_00[lVar29 + -1].avg_sr_fr_ratio - dVar42
                             ) / (double)iVar8;
                    if (regions_00[lVar29].avg_sr_fr_ratio <= dVar37) {
                      dVar37 = regions_00[lVar29].avg_sr_fr_ratio;
                    }
                  }
                  if (dVar37 * 0.95 < dVar42) {
                    remove_region(0,regions_00,(int *)&local_ec,(int *)&local_f0);
                    analyze_region(stats_start,local_f0 - 1,regions_00);
                    goto LAB_00204cfc;
                  }
                }
                local_cc = local_f0 - 1;
                insert_region(regions_00[lVar29 + -1].last,regions_00[lVar29 + -1].last,
                              HIGH_VAR_REGION,regions_00,(int *)&local_ec,&local_cc);
                iVar8 = local_cc;
                analyze_region(stats_start,local_cc,regions_00);
                piVar16 = local_b8;
                local_f0 = iVar8 + 1;
                analyze_region(stats_start,local_f0,regions_00);
              }
              local_f0 = local_f0 + 1;
            }
LAB_00204cfc:
            uVar17 = (ulong)local_ec;
          } while ((int)local_f0 < (int)local_ec);
        }
        cleanup_regions(regions_00,(int *)&local_ec);
        pdVar10 = local_98;
        local_f0 = 0;
        auVar36 = _DAT_004d4170;
        do {
          if ((int)local_ec < 2) break;
          lVar29 = (long)(int)local_f0;
          pRVar20 = regions_00 + lVar29;
          if (regions_00[lVar29].type == BLENDING_REGION) {
            bVar32 = pRVar20->last - pRVar20->start < 4;
          }
          else {
            bVar32 = false;
          }
          bVar4 = true;
          if (regions_00[lVar29].type == HIGH_VAR_REGION) {
            bVar4 = 3 < pRVar20->last - pRVar20->start;
          }
          if (((int)local_f0 < 1) || (local_60[lVar29 * 0xe] != STABLE_REGION)) {
            bVar33 = false;
            if ((int)local_f0 < (int)(local_ec - 1)) {
              bVar33 = pRVar20[1].type == STABLE_REGION;
            }
          }
          else {
            bVar33 = true;
          }
          if ((((int)local_f0 < 1) || (bVar34 = true, local_60[lVar29 * 0xe] != BLENDING_REGION)) &&
             (bVar34 = false, (int)local_f0 < (int)(local_ec - 1))) {
            bVar34 = pRVar20[1].type == BLENDING_REGION;
          }
          if ((bVar32) ||
             (!bVar4 && (byte)(((int)local_f0 < (int)(local_ec - 1)) + (0 < (int)local_f0)) <=
                        (byte)(bVar34 + bVar33))) {
            dVar42 = 1.0;
            if (0 < (int)local_f0) {
              dVar42 = (double)((ulong)(regions_00[lVar29].avg_cor_coeff - local_38[lVar29 * 7]) &
                               auVar36._0_8_);
            }
            dVar37 = 1.0;
            if ((int)local_f0 < (int)(local_ec - 1)) {
              dVar37 = (double)((ulong)(regions_00[lVar29].avg_cor_coeff - pRVar20[1].avg_cor_coeff)
                               & auVar36._0_8_);
            }
            remove_region((uint)(dVar37 < dVar42),regions_00,(int *)&local_ec,(int *)&local_f0);
            auVar36 = _DAT_004d4170;
          }
          else {
            local_f0 = local_f0 + 1;
          }
        } while ((int)local_f0 < (int)local_ec);
        cleanup_regions(regions_00,(int *)&local_ec);
        local_e8 = 0;
        if (0 < (int)local_ec) {
          do {
            if (regions_00[local_e8].type == STABLE_REGION) {
              iVar8 = regions_00[local_e8].start;
              iVar18 = regions_00[local_e8].last;
              piVar16 = local_b8;
              pdVar10 = local_98;
              if (iVar8 <= iVar18) {
                piVar24 = local_68 + (long)iVar8 * 0x1d;
                do {
                  if (*piVar24 != 0) {
                    insert_region(iVar8,iVar8,HIGH_VAR_REGION,regions_00,(int *)&local_ec,&local_e8)
                    ;
                  }
                  iVar8 = iVar8 + 1;
                  piVar24 = piVar24 + 0x1d;
                  piVar16 = local_b8;
                  pdVar10 = local_98;
                } while (iVar18 + 1 != iVar8);
              }
            }
            local_e8 = local_e8 + 1;
          } while (local_e8 < (int)local_ec);
        }
        pRVar20 = regions_00;
        cleanup_regions(regions_00,(int *)&local_ec);
        num_regions_00 = local_58;
        regions_01 = local_a8;
        lVar29 = (long)(int)local_c0;
        if ((long)(int)local_ec < 1) {
          local_e8 = 0;
          uVar31 = local_ec;
        }
        else {
          pRVar20 = (REGIONS *)((ulong)(local_ec - 1) * 0x38);
          lVar25 = 0;
          local_e8 = 0;
          do {
            if ((*(int *)((long)&regions_00->last + lVar25) <
                 *(int *)((long)&regions_00->start + lVar25)) &&
               (uVar31 = local_ec - 1, (long)pRVar20 - lVar25 == 0)) break;
            puVar1 = (undefined8 *)((long)&regions_00->start + lVar25);
            *(undefined8 *)((long)&local_a8[lVar29].type + lVar25) = puVar1[6];
            uVar6 = *puVar1;
            uVar7 = puVar1[1];
            auVar36 = *(undefined1 (*) [16])(puVar1 + 2);
            *(undefined1 (*) [16])((long)&local_a8[lVar29].avg_intra_err + lVar25) =
                 *(undefined1 (*) [16])(puVar1 + 4);
            *(undefined1 (*) [16])((long)&local_a8[lVar29].avg_cor_coeff + lVar25) = auVar36;
            puVar1 = (undefined8 *)((long)&local_a8[lVar29].start + lVar25);
            *puVar1 = uVar6;
            puVar1[1] = uVar7;
            local_e8 = local_e8 + 1;
            lVar25 = lVar25 + 0x38;
            uVar31 = local_ec;
          } while ((long)(int)local_ec * 0x38 - lVar25 != 0);
        }
        local_ec = uVar31;
        local_c0 = (int)local_ec + lVar29;
        iVar8 = (int)local_d8;
        iVar18 = (int)local_c0;
        if (iVar8 < 0) {
          *local_58 = iVar18;
          if (0 < iVar18) {
            iVar8 = 0;
            do {
              analyze_region(stats_start,iVar8,regions_01);
              iVar8 = iVar8 + 1;
            } while (iVar18 != iVar8);
          }
          if (*num_regions_00 < 1) {
            lVar29 = 0;
          }
          else {
            pRVar13 = &regions_01->type;
            lVar29 = 0;
            do {
              if ((*pRVar13 == SCENECUT_REGION) &&
                 (0.8 <= (1.0 - stats_start[((REGIONS *)(pRVar13 + -0xc))->start].noise_var /
                                *(double *)(pRVar13 + -4)) * *(double *)(pRVar13 + -8))) {
                *pRVar13 = HIGH_VAR_REGION;
              }
              lVar29 = lVar29 + 1;
              pRVar13 = pRVar13 + 0xe;
            } while (lVar29 < *num_regions_00);
          }
          local_e8 = (int)lVar29;
          cleanup_regions(regions_01,num_regions_00);
          iVar8 = *num_regions_00;
          if (0 < iVar8) {
            iVar18 = 0;
            do {
              analyze_region(stats_start,iVar18,regions_01);
              iVar18 = iVar18 + 1;
            } while (iVar8 != iVar18);
          }
          lVar29 = 0;
          if (0 < *num_regions_00) {
            lVar29 = 0;
            do {
              uVar2 = regions_01->start;
              uVar3 = regions_01->last;
              regions_01->start = uVar2 + local_84;
              regions_01->last = uVar3 + local_84;
              lVar29 = lVar29 + 1;
              regions_01 = regions_01 + 1;
            } while (lVar29 < *num_regions_00);
          }
          local_e8 = (int)lVar29;
          free_firstpass_stats_buffers(regions_00,local_e0,local_98,local_b0);
          return 0;
        }
        local_a8[local_c0].type = SCENECUT_REGION;
        local_a8[local_c0].start = iVar8;
        local_a8[local_c0].last = iVar8;
        local_c0 = (ulong)(iVar18 + 1);
        uVar31 = iVar8 + 1;
      } while( true );
    }
    free_firstpass_stats_buffers(regions_00,pdVar9,pdVar10,local_b0);
    iVar8 = -1;
  }
  return iVar8;
}

Assistant:

static int identify_regions(const FIRSTPASS_STATS *const stats_start,
                            int total_frames, int offset, REGIONS *regions,
                            int *total_regions) {
  int k;
  if (total_frames <= 1) return 0;

  // store the initial decisions
  REGIONS *temp_regions =
      (REGIONS *)aom_malloc(total_frames * sizeof(temp_regions[0]));
  // buffers for filtered stats
  double *filt_intra_err =
      (double *)aom_calloc(total_frames, sizeof(*filt_intra_err));
  double *filt_coded_err =
      (double *)aom_calloc(total_frames, sizeof(*filt_coded_err));
  double *grad_coded = (double *)aom_calloc(total_frames, sizeof(*grad_coded));
  if (!(temp_regions && filt_intra_err && filt_coded_err && grad_coded)) {
    free_firstpass_stats_buffers(temp_regions, filt_intra_err, filt_coded_err,
                                 grad_coded);
    return -1;
  }
  av1_zero_array(temp_regions, total_frames);

  int cur_region = 0, this_start = 0, this_last;

  int next_scenecut = -1;
  do {
    // first get the obvious scenecuts
    next_scenecut =
        find_next_scenecut(stats_start, this_start, total_frames - 1);
    this_last = (next_scenecut >= 0) ? (next_scenecut - 1) : total_frames - 1;

    // low-pass filter the needed stats
    smooth_filter_stats(stats_start, this_start, this_last, filt_intra_err,
                        filt_coded_err);
    get_gradient(filt_coded_err, this_start, this_last, grad_coded);

    // find tentative stable regions and unstable regions
    int num_regions = find_stable_regions(stats_start, grad_coded, this_start,
                                          this_last, temp_regions);

    adjust_unstable_region_bounds(stats_start, temp_regions, &num_regions);

    get_region_stats(stats_start, temp_regions, num_regions);

    // Try to identify blending regions in the unstable regions
    find_blending_regions(stats_start, temp_regions, &num_regions);
    cleanup_blendings(temp_regions, &num_regions);

    // The flash points should all be considered high variance points
    k = 0;
    while (k < num_regions) {
      if (temp_regions[k].type != STABLE_REGION) {
        k++;
        continue;
      }
      int start = temp_regions[k].start;
      int last = temp_regions[k].last;
      for (int i = start; i <= last; i++) {
        if (stats_start[i].is_flash) {
          insert_region(i, i, HIGH_VAR_REGION, temp_regions, &num_regions, &k);
        }
      }
      k++;
    }
    cleanup_regions(temp_regions, &num_regions);

    // copy the regions in the scenecut group
    for (k = 0; k < num_regions; k++) {
      if (temp_regions[k].last < temp_regions[k].start &&
          k == num_regions - 1) {
        num_regions--;
        break;
      }
      regions[k + cur_region] = temp_regions[k];
    }
    cur_region += num_regions;

    // add the scenecut region
    if (next_scenecut > -1) {
      // add the scenecut region, and find the next scenecut
      regions[cur_region].type = SCENECUT_REGION;
      regions[cur_region].start = next_scenecut;
      regions[cur_region].last = next_scenecut;
      cur_region++;
      this_start = next_scenecut + 1;
    }
  } while (next_scenecut >= 0);

  *total_regions = cur_region;
  get_region_stats(stats_start, regions, *total_regions);

  for (k = 0; k < *total_regions; k++) {
    // If scenecuts are very minor, mark them as high variance.
    if (regions[k].type != SCENECUT_REGION ||
        regions[k].avg_cor_coeff *
                (1 - stats_start[regions[k].start].noise_var /
                         regions[k].avg_intra_err) <
            0.8) {
      continue;
    }
    regions[k].type = HIGH_VAR_REGION;
  }
  cleanup_regions(regions, total_regions);
  get_region_stats(stats_start, regions, *total_regions);

  for (k = 0; k < *total_regions; k++) {
    regions[k].start += offset;
    regions[k].last += offset;
  }

  free_firstpass_stats_buffers(temp_regions, filt_intra_err, filt_coded_err,
                               grad_coded);
  return 0;
}